

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O1

char * u_getTimeZoneFilesDirectory_63(UErrorCode *status)

{
  UBool UVar1;
  char *pcVar2;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (gTimeZoneFilesInitOnce_63.fState.super___atomic_base<int>._M_i != 2) {
      UVar1 = icu_63::umtx_initImplPreInit(&gTimeZoneFilesInitOnce_63);
      if (UVar1 != '\0') {
        TimeZoneDataDirInitFn(status);
        gTimeZoneFilesInitOnce_63.fErrCode = *status;
        icu_63::umtx_initImplPostInit(&gTimeZoneFilesInitOnce_63);
        goto LAB_0029c724;
      }
    }
    if (U_ZERO_ERROR < gTimeZoneFilesInitOnce_63.fErrCode) {
      *status = gTimeZoneFilesInitOnce_63.fErrCode;
    }
  }
LAB_0029c724:
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar2 = (gTimeZoneFilesDirectory->buffer).ptr;
  }
  else {
    pcVar2 = "";
  }
  return pcVar2;
}

Assistant:

U_CAPI const char * U_EXPORT2
u_getTimeZoneFilesDirectory(UErrorCode *status) {
    umtx_initOnce(gTimeZoneFilesInitOnce, &TimeZoneDataDirInitFn, *status);
    return U_SUCCESS(*status) ? gTimeZoneFilesDirectory->data() : "";
}